

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void * btreeblk_move(void *voidhandle,bid_t bid,bid_t *new_bid)

{
  long *plVar1;
  char *pcVar2;
  uint len;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  void *__dest;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bid_t bid_00;
  int sb_no;
  long lVar9;
  ulong uVar10;
  void *local_50;
  bid_t _new_bid;
  
  if ((char)(bid >> 0x30) == '\0') {
    pvVar4 = btreeblk_read(voidhandle,bid);
    __dest = btreeblk_alloc(voidhandle,new_bid);
    *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
    memcpy(__dest,pvVar4,(ulong)*voidhandle);
    _btreeblk_add_stale_block((btreeblk_handle *)voidhandle,*voidhandle * bid,*voidhandle);
    return __dest;
  }
  lVar9 = (ulong)((uint)(bid >> 0x35) & 7) - 1;
  uVar10 = (ulong)((ushort)(bid >> 0x30) & 0x1f);
  sb_no = (int)lVar9;
  pvVar4 = _btreeblk_read(voidhandle,bid & 0xffffffffffff,sb_no);
  lVar6 = *(long *)((long)voidhandle + 0x60);
  lVar9 = lVar9 * 0x18;
  uVar5 = (ulong)*(ushort *)(lVar6 + 0xc + lVar9);
  uVar7 = 0xffffffffffffffff;
  do {
    uVar8 = uVar5;
    if (uVar7 - uVar5 == -1) break;
    uVar8 = uVar7 + 1;
    pcVar2 = (char *)(((bid_t *)(lVar6 + lVar9))[2] + 1 + uVar7);
    uVar7 = uVar8;
  } while (*pcVar2 != '\0');
  bid_00 = *(bid_t *)(lVar6 + lVar9);
  if (uVar8 != uVar5 && bid_00 != 0xffffffffffffffff) {
    iVar3 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),bid_00);
    lVar6 = *(long *)((long)voidhandle + 0x60);
    bid_00 = *(bid_t *)(lVar6 + lVar9);
    if (iVar3 != 0) {
      local_50 = _btreeblk_read(voidhandle,bid_00,sb_no);
      goto LAB_0010ccac;
    }
  }
  if (bid_00 != 0xffffffffffffffff) {
    for (uVar7 = 0; uVar7 < *(ushort *)(lVar6 + 0xc + lVar9); uVar7 = uVar7 + 1) {
      plVar1 = (long *)(lVar6 + lVar9);
      if (*(char *)(plVar1[2] + uVar7) == '\0') {
        _btreeblk_add_stale_block
                  ((btreeblk_handle *)voidhandle,
                   (ulong)((int)uVar7 * *(uint32_t *)(plVar1 + 1)) + (ulong)*voidhandle * *plVar1,
                   *(uint32_t *)(plVar1 + 1));
        lVar6 = *(long *)((long)voidhandle + 0x60);
      }
    }
  }
  local_50 = _btreeblk_alloc(voidhandle,&_new_bid,sb_no);
  *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
  lVar6 = *(long *)((long)voidhandle + 0x60);
  *(bid_t *)(lVar6 + lVar9) = _new_bid;
  uVar8 = 0;
  memset(*(void **)(lVar6 + 0x10 + lVar9),0,(ulong)*(ushort *)(lVar6 + 0xc + lVar9));
LAB_0010ccac:
  *(undefined1 *)(*(long *)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar9) + uVar8) = 1;
  lVar6 = *(long *)((long)voidhandle + 0x60);
  *new_bid = (ulong)(sb_no * 0x20 + 0x20U | (uint)uVar8) << 0x30 | *(ulong *)(lVar6 + lVar9);
  btreeblk_set_dirty(voidhandle,*(bid_t *)(lVar6 + lVar9));
  uVar7 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar9);
  memcpy((void *)(uVar8 * uVar7 + (long)local_50),(void *)((long)pvVar4 + uVar10 * uVar7),uVar7);
  len = *(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar9);
  _btreeblk_add_stale_block
            ((btreeblk_handle *)voidhandle,
             uVar10 * len + (bid & 0xffffffffffff) * (ulong)*voidhandle,len);
  return (void *)(*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar9) * uVar8 + (long)local_50
                 );
}

Assistant:

void * btreeblk_move(void *voidhandle, bid_t bid, bid_t *new_bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    void *old_addr, *new_addr;
    bid_t _old_bid, _new_bid;
    int i, subblock;
    size_t sb, old_sb_idx, new_sb_idx;

    old_addr = new_addr = NULL;
    sb = old_sb_idx = 0;
    subbid2bid(bid, &sb, &old_sb_idx, &_old_bid);
    subblock = is_subblock(bid);

    int convert_to_normal = 0;
#ifndef __BTREEBLK_SUBBLOCK
    convert_to_normal = 1;
#endif

    if (!subblock) {
        // normal block
        old_addr = btreeblk_read(voidhandle, bid);
        new_addr = btreeblk_alloc(voidhandle, new_bid);
        handle->nlivenodes--;

        // move
        memcpy(new_addr, old_addr, (handle->nodesize));

        // the entire block becomes stale
        _btreeblk_add_stale_block(handle, bid * handle->nodesize, handle->nodesize);

        return new_addr;
    } else {
        // subblock

        // move the target subblock
        // into the current subblock set
        old_addr = _btreeblk_read(voidhandle, _old_bid, sb);

        new_sb_idx = handle->sb[sb].nblocks;
        for (i=0;i<handle->sb[sb].nblocks;++i){
            if (handle->sb[sb].bitmap[i] == 0) {
                new_sb_idx = i;
                break;
            }
        }
        if ( handle->sb[sb].bid == BLK_NOT_FOUND ||
             new_sb_idx == handle->sb[sb].nblocks ||
             !filemgr_is_writable(handle->file, handle->sb[sb].bid) ||
             convert_to_normal ) {
            // There is no free slot in the parent block, OR
            // the parent block is not writable, OR
            // `convert_to_normal` flag is on.

            // Mark all unused subblocks in the current parent block as stale
            if (handle->sb[sb].bid != BLK_NOT_FOUND) {
                for (i=0; i<handle->sb[sb].nblocks; ++i) {
                    if (handle->sb[sb].bitmap[i] == 0) {
                        _btreeblk_add_stale_block
                        ( handle,
                          ( (handle->sb[sb].bid * handle->nodesize) +
                            (i * handle->sb[sb].sb_size) ),
                          handle->sb[sb].sb_size );
                    }
                }
            }

            if (convert_to_normal) {
                // Whole block.
                new_addr = btreeblk_alloc(voidhandle, &_new_bid);
                handle->nlivenodes--;
            } else {
                // Allocate new parent block.
                new_addr = _btreeblk_alloc(voidhandle, &_new_bid, sb);
                handle->nlivenodes--;
                handle->sb[sb].bid = _new_bid;
                memset(handle->sb[sb].bitmap, 0, handle->sb[sb].nblocks);
            }
            new_sb_idx = 0;

        } else {
            // just append to the current block
            new_addr = _btreeblk_read(voidhandle, handle->sb[sb].bid, sb);
        }

        if (convert_to_normal) {
            *new_bid = _new_bid;
        } else {
            handle->sb[sb].bitmap[new_sb_idx] = 1;
            bid2subbid(handle->sb[sb].bid, sb, new_sb_idx, new_bid);
            btreeblk_set_dirty(voidhandle, handle->sb[sb].bid);
        }

        // move
        memcpy( (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx,
                (uint8_t*)old_addr + handle->sb[sb].sb_size * old_sb_idx,
                handle->sb[sb].sb_size );

        // Also mark the target (old) subblock as stale
        _btreeblk_add_stale_block
        ( handle,
          (_old_bid * handle->nodesize) + (old_sb_idx * handle->sb[sb].sb_size),
           handle->sb[sb].sb_size );

        return (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx;
    }
}